

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_flac__seek_to_approximate_flac_frame_to_byte
                    (ma_dr_flac *pFlac,ma_uint64 targetByte,ma_uint64 rangeLo,ma_uint64 rangeHi,
                    ma_uint64 *pLastSuccessfulSeekOffset)

{
  ma_bool32 mVar1;
  bool bVar2;
  
  *pLastSuccessfulSeekOffset = pFlac->firstFLACFramePosInBytes;
  do {
    mVar1 = ma_dr_flac__seek_to_byte(&pFlac->bs,targetByte);
    if (mVar1 == 0) {
      if (targetByte == 0) {
        ma_dr_flac__seek_to_first_frame(pFlac);
        return 0;
      }
    }
    else {
      memset(&pFlac->currentFLACFrame,0,0xa0);
      mVar1 = ma_dr_flac__read_and_decode_next_flac_frame(pFlac);
      if (mVar1 != 0) {
        ma_dr_flac__get_pcm_frame_range_of_current_flac_frame
                  (pFlac,&pFlac->currentPCMFrame,(ma_uint64 *)0x0);
        *pLastSuccessfulSeekOffset = targetByte;
        return 1;
      }
    }
    rangeHi = (rangeHi - rangeLo >> 1) + rangeLo;
    bVar2 = rangeHi != targetByte;
    targetByte = rangeHi;
  } while (bVar2);
  return 0;
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_approximate_flac_frame_to_byte(ma_dr_flac* pFlac, ma_uint64 targetByte, ma_uint64 rangeLo, ma_uint64 rangeHi, ma_uint64* pLastSuccessfulSeekOffset)
{
    MA_DR_FLAC_ASSERT(pFlac != NULL);
    MA_DR_FLAC_ASSERT(pLastSuccessfulSeekOffset != NULL);
    MA_DR_FLAC_ASSERT(targetByte >= rangeLo);
    MA_DR_FLAC_ASSERT(targetByte <= rangeHi);
    *pLastSuccessfulSeekOffset = pFlac->firstFLACFramePosInBytes;
    for (;;) {
        ma_uint64 lastTargetByte = targetByte;
        if (!ma_dr_flac__seek_to_byte(&pFlac->bs, targetByte)) {
            if (targetByte == 0) {
                ma_dr_flac__seek_to_first_frame(pFlac);
                return MA_FALSE;
            }
            targetByte = rangeLo + ((rangeHi - rangeLo)/2);
            rangeHi = targetByte;
        } else {
            MA_DR_FLAC_ZERO_MEMORY(&pFlac->currentFLACFrame, sizeof(pFlac->currentFLACFrame));
#if 1
            if (!ma_dr_flac__read_and_decode_next_flac_frame(pFlac)) {
                targetByte = rangeLo + ((rangeHi - rangeLo)/2);
                rangeHi = targetByte;
            } else {
                break;
            }
#else
            if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
                targetByte = rangeLo + ((rangeHi - rangeLo)/2);
                rangeHi = targetByte;
            } else {
                break;
            }
#endif
        }
        if(targetByte == lastTargetByte) {
            return MA_FALSE;
        }
    }
    ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac, &pFlac->currentPCMFrame, NULL);
    MA_DR_FLAC_ASSERT(targetByte <= rangeHi);
    *pLastSuccessfulSeekOffset = targetByte;
    return MA_TRUE;
}